

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v3
          (TPZDohrSubstruct<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *v3,
          TPZFMatrix<std::complex<float>_> *r,TPZFMatrix<std::complex<float>_> *v1Plusv2)

{
  int iVar1;
  pair<int,_int> *ppVar2;
  TPZMatrix<std::complex<float>_> *pTVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  TPZFNMatrix<100,_std::complex<float>_> vec_t;
  TPZFNMatrix<100,_std::complex<float>_> inv_sys;
  TPZFNMatrix<100,_std::complex<float>_> vec_t3;
  TPZFNMatrix<100,_std::complex<float>_> vec_t2;
  float local_f48;
  float fStack_f44;
  undefined8 local_f38;
  complex<float> local_f18;
  TPZFNMatrix<100,_std::complex<float>_> local_f10;
  TPZFNMatrix<100,_std::complex<float>_> local_b58;
  TPZFNMatrix<100,_std::complex<float>_> local_7a0;
  TPZFNMatrix<100,_std::complex<float>_> local_3e8;
  
  local_3e8.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (&local_f10,(long)this->fNEquations,1,(complex<float> *)&local_3e8);
  local_7a0.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (&local_3e8,(long)this->fNEquations,1,(complex<float> *)&local_7a0);
  local_b58.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (&local_7a0,(this->fInternalEqs).fNElements,1,(complex<float> *)&local_b58);
  local_f18._M_value = 0;
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (&local_b58,(this->fInternalEqs).fNElements,1,&local_f18);
  uVar4 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      ppVar2 = (this->fGlobalEqs).fStore;
      iVar1 = ppVar2[uVar5].first;
      lVar8 = (long)ppVar2[uVar5].second;
      if (((lVar8 < 0) ||
          ((v1Plusv2->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar8)) ||
         ((v1Plusv2->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar1 < 0) ||
          (local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
           super_TPZBaseMatrix.fRow <= iVar1)) ||
         (local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
          super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_f10.super_TPZFMatrix<std::complex<float>_>.fElem[iVar1]._M_value =
           v1Plusv2->fElem[lVar8]._M_value;
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  pTVar3 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar3,&local_f10,&local_3e8);
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      ppVar2 = (this->fGlobalEqs).fStore;
      iVar1 = ppVar2[uVar5].first;
      (*(r->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(r,(long)ppVar2[uVar5].second,0);
      local_f38 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      if (((iVar1 < 0) ||
          (local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
           super_TPZBaseMatrix.fRow <= iVar1)) ||
         (local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
          super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_f10.super_TPZFMatrix<std::complex<float>_>.fElem[iVar1]._M_value = local_f38;
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  if (0 < (this->fInternalEqs).fNElements) {
    lVar8 = 0;
    do {
      lVar6 = (long)(this->fInternalEqs).fStore[lVar8];
      if (((lVar6 < 0) ||
          (local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
           super_TPZBaseMatrix.fRow <= lVar6)) ||
         (local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
          super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar7 = (long)(this->fInternalEqs).fStore[lVar8];
      if (((lVar7 < 0) ||
          (local_3e8.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
           super_TPZBaseMatrix.fRow <= lVar7)) ||
         (local_3e8.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
          super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_7a0.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
           super_TPZBaseMatrix.fRow <= lVar8) ||
         (local_7a0.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
          super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_f38._0_4_ =
           (float)local_f10.super_TPZFMatrix<std::complex<float>_>.fElem[lVar6]._M_value;
      local_f38._4_4_ =
           (float)(local_f10.super_TPZFMatrix<std::complex<float>_>.fElem[lVar6]._M_value >> 0x20);
      local_f48 = (float)local_3e8.super_TPZFMatrix<std::complex<float>_>.fElem[lVar7]._M_value;
      fStack_f44 = (float)(local_3e8.super_TPZFMatrix<std::complex<float>_>.fElem[lVar7]._M_value >>
                          0x20);
      local_7a0.super_TPZFMatrix<std::complex<float>_>.fElem[lVar8]._M_value =
           CONCAT44(local_f38._4_4_ - fStack_f44,(float)local_f38 - local_f48);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->fInternalEqs).fNElements);
  }
  TPZStepSolver<std::complex<float>_>::Solve
            (&this->fInvertedInternalStiffness,&local_7a0.super_TPZFMatrix<std::complex<float>_>,
             &local_b58.super_TPZFMatrix<std::complex<float>_>,
             (TPZFMatrix<std::complex<float>_> *)0x0);
  memset(local_f10.super_TPZFMatrix<std::complex<float>_>.fElem,0,
         local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
         super_TPZBaseMatrix.fRow *
         local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
         super_TPZBaseMatrix.fCol * 8);
  local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.fDecomposed = '\0';
  if (0 < (this->fInternalEqs).fNElements) {
    lVar8 = 0;
    do {
      if ((local_b58.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
           super_TPZBaseMatrix.fRow <= lVar8) ||
         (local_b58.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
          super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (long)(this->fInternalEqs).fStore[lVar8];
      if ((lVar6 < 0) ||
         ((local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
           super_TPZBaseMatrix.fRow <= lVar6 ||
          (local_f10.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
           super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_f10.super_TPZFMatrix<std::complex<float>_>.fElem[lVar6]._M_value =
           local_b58.super_TPZFMatrix<std::complex<float>_>.fElem[lVar8]._M_value;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->fInternalEqs).fNElements);
  }
  TPZFMatrix<std::complex<float>_>::operator=(v3,&local_f10.super_TPZFMatrix<std::complex<float>_>);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix
            (&local_b58.super_TPZFMatrix<std::complex<float>_>,&PTR_PTR_018606a8);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix
            (&local_7a0.super_TPZFMatrix<std::complex<float>_>,&PTR_PTR_018606a8);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix
            (&local_3e8.super_TPZFMatrix<std::complex<float>_>,&PTR_PTR_018606a8);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix
            (&local_f10.super_TPZFMatrix<std::complex<float>_>,&PTR_PTR_018606a8);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v3(TPZFMatrix<TVar> &v3, const TPZFMatrix<TVar> &r, TPZFMatrix<TVar> &v1Plusv2) const {
	TPZFNMatrix<100,TVar> vec_t(fNEquations,1,0.);
	TPZFNMatrix<100,TVar> vec_t2(fNEquations,1,0.);
	TPZFNMatrix<100,TVar> vec_t3(fInternalEqs.NElements(),1,0.);
	TPZFNMatrix<100,TVar> inv_sys(fInternalEqs.NElements(),1,0.);
	int i;
	int neqs = fGlobalEqs.NElements();
	//vec_t=R(i)(v1+v2)
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		vec_t(ind.first,0) = v1Plusv2(ind.second,0);
	}
	//vec_t2=K(i)*vec_t
	fStiffness->Multiply(vec_t, vec_t2, 0);
	//vec_t=R(i)r
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		vec_t(ind.first,0) = r.GetVal(ind.second,0);
	}
	//vec_t3=R(Ii)*(vec_t - vec_t2)
	for (i=0;i<fInternalEqs.NElements();i++) {
		vec_t3(i,0) = vec_t(fInternalEqs[i],0) - vec_t2(fInternalEqs[i],0);
	}
	//inv_sys = temp_inverted * vec_t3
	fInvertedInternalStiffness.Solve(vec_t3, inv_sys);
	//vec_t=R(Ii)_transposed * inv_sys
	vec_t.Zero();
	for (i=0;i<fInternalEqs.NElements();i++) {
		vec_t(fInternalEqs[i],0) = inv_sys(i,0);
	}
#ifndef MAKEINTERNAL
	//v3=v3+R(i)_transposed*vec_t
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		v3(ind.second,0) += vec_t(ind.first,0);
	}
#else
	v3 = vec_t;
#endif
	
}